

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O0

void __thiscall pass_inline_pass_Test::TestBody(pass_inline_pass_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  Generator *pGVar3;
  Port *pPVar4;
  Var *pVVar5;
  Expr *right;
  element_type *peVar6;
  char *pcVar7;
  mapped_type *pmVar8;
  char *in_R9;
  AssertHelper local_430;
  Message local_428;
  unsigned_long local_420;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  key_type local_400;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  string local_3b0 [8];
  mapped_type src;
  VerilogModule vmod;
  AssertHelper local_318;
  Message local_310;
  allocator<char> local_301;
  string local_300;
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_;
  shared_ptr<kratos::Attribute> attr;
  string local_2b0;
  Var *local_290;
  Var *v2;
  string local_280;
  Var *local_260;
  Var *v1;
  string local_250;
  Var *local_230;
  Var *v;
  string local_220;
  Port *local_200;
  Port *in2;
  string local_1f0;
  Port *local_1d0;
  Port *in1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  Generator *local_178;
  Generator *child;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context ctx;
  pass_inline_pass_Test *this_local;
  
  ctx.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"child",&local_199);
  pGVar3 = kratos::Context::generator((Context *)&mod,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pGVar2 = local_138;
  local_178 = pGVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"inst",(allocator<char> *)((long)&in1 + 7));
  kratos::Generator::add_child_generator(pGVar2,&local_1c0,local_178);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in1 + 7));
  pGVar2 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"in1",(allocator<char> *)((long)&in2 + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_1f0,1);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&in2 + 7));
  pGVar2 = local_178;
  local_1d0 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"in2",(allocator<char> *)((long)&v + 7));
  pPVar4 = kratos::Generator::port(pGVar2,In,&local_220,1);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v + 7));
  pGVar2 = local_178;
  local_200 = pPVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,"v",(allocator<char> *)((long)&v1 + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_250,1);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v1 + 7));
  pGVar2 = local_178;
  local_230 = pVVar5;
  right = kratos::Var::operator&(&local_1d0->super_Var,&local_200->super_Var);
  kratos::Generator::wire(pGVar2,pVVar5,&right->super_Var);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"v1",(allocator<char> *)((long)&v2 + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_280,1);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v2 + 7));
  pGVar2 = local_138;
  local_260 = pVVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"v2",
             (allocator<char> *)
             ((long)&attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  pVVar5 = kratos::Generator::var(pGVar2,&local_2b0,1);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  local_290 = pVVar5;
  kratos::Generator::wire(local_138,&local_1d0->super_Var,local_260);
  kratos::Generator::wire(local_138,&local_200->super_Var,local_290);
  kratos::fix_assignment_type(local_138);
  kratos::verify_generator_connectivity(local_138);
  kratos::verify_assignments(local_138);
  std::make_shared<kratos::Attribute>();
  peVar6 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  std::__cxx11::string::operator=((string *)&peVar6->value_str,"inline");
  kratos::IRNode::add_attribute
            (&local_178->super_IRNode,(shared_ptr<kratos::Attribute> *)&gtest_ar_.message_);
  kratos::inline_instance(local_138);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"inst",&local_301);
  bVar1 = kratos::Generator::has_child_generator(pGVar2,&local_300);
  local_2d9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_310);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vmod.manager_.collect_perf_,(internal *)local_2d8,
               (AssertionResult *)"mod.has_child_generator(\"inst\")","true","false",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_318,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x1e3,pcVar7);
    testing::internal::AssertHelper::operator=(&local_318,&local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_318);
    std::__cxx11::string::~string((string *)&vmod.manager_.collect_perf_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  kratos::VerilogModule::VerilogModule((VerilogModule *)((long)&src.field_2 + 8),local_138);
  kratos::VerilogModule::verilog_src_abi_cxx11_
            (&local_3e0,(VerilogModule *)((long)&src.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_400,"mod",
             (allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&local_3e0,&local_400);
  std::__cxx11::string::string(local_3b0,(string *)pmVar8);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_3e0);
  local_420 = std::__cxx11::string::find((char *)local_3b0,0x4309d6);
  testing::internal::CmpHelperNE<unsigned_long,unsigned_long>
            ((internal *)local_418,"src.find(\"assign v = v1 & v2;\")","std::string::npos",
             &local_420,&std::__cxx11::string::npos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_430,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x1e7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_430,&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_430);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  std::__cxx11::string::~string(local_3b0);
  kratos::VerilogModule::~VerilogModule((VerilogModule *)((long)&src.field_2 + 8));
  std::shared_ptr<kratos::Attribute>::~shared_ptr
            ((shared_ptr<kratos::Attribute> *)&gtest_ar_.message_);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(pass, inline_pass) {
    Context ctx;
    auto &mod = ctx.generator("mod");
    auto &child = ctx.generator("child");
    mod.add_child_generator("inst", child);
    auto &in1 = child.port(PortDirection::In, "in1", 1);
    auto &in2 = child.port(PortDirection::In, "in2", 1);
    auto &v = child.var("v", 1);
    child.wire(v, in1 & in2);
    auto &v1 = mod.var("v1", 1);
    auto &v2 = mod.var("v2", 1);
    mod.wire(in1, v1);
    mod.wire(in2, v2);

    fix_assignment_type(&mod);
    verify_generator_connectivity(&mod);
    verify_assignments(&mod);

    auto attr = std::make_shared<Attribute>();
    attr->value_str = "inline";
    child.add_attribute(attr);

    inline_instance(&mod);

    EXPECT_FALSE(mod.has_child_generator("inst"));

    VerilogModule vmod(&mod);
    auto src = vmod.verilog_src()["mod"];
    EXPECT_NE(src.find("assign v = v1 & v2;"), std::string::npos);
}